

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int vdbeSorterSort(SortSubtask *pTask,SorterList *pList)

{
  u8 uVar1;
  uint uVar2;
  SorterCompare p_Var3;
  undefined8 *p;
  SorterRecord *pSVar4;
  SorterRecord *pSVar5;
  code *pcVar6;
  undefined8 *puVar7;
  long lVar8;
  SorterRecord *pSVar9;
  
  uVar2 = vdbeSortAllocUnpacked(pTask);
  if (uVar2 == 0) {
    pSVar4 = pList->pList;
    uVar1 = pTask->pSorter->typeMask;
    pcVar6 = vdbeSorterCompare;
    if (uVar1 == '\x02') {
      pcVar6 = vdbeSorterCompareText;
    }
    p_Var3 = vdbeSorterCompareInt;
    if (uVar1 != '\x01') {
      p_Var3 = pcVar6;
    }
    pTask->xCompare = p_Var3;
    p = (undefined8 *)sqlite3MallocZero(0x200);
    if (p == (undefined8 *)0x0) {
      uVar2 = 7;
    }
    else {
      while (pSVar4 != (SorterRecord *)0x0) {
        pSVar9 = (SorterRecord *)pList->aMemory;
        if (pSVar9 == (SorterRecord *)0x0) {
          pSVar9 = (pSVar4->u).pNext;
        }
        else if (pSVar4 == pSVar9) {
          pSVar9 = (SorterRecord *)0x0;
        }
        else {
          pSVar9 = (SorterRecord *)((long)&pSVar9->nVal + (long)(pSVar4->u).iNext);
        }
        (pSVar4->u).pNext = (SorterRecord *)0x0;
        for (puVar7 = p; (SorterRecord *)*puVar7 != (SorterRecord *)0x0; puVar7 = puVar7 + 1) {
          pSVar4 = vdbeSorterMerge(pTask,pSVar4,(SorterRecord *)*puVar7);
          *puVar7 = 0;
        }
        *puVar7 = pSVar4;
        pSVar4 = pSVar9;
      }
      pSVar4 = (SorterRecord *)0x0;
      for (lVar8 = 0; lVar8 != 0x40; lVar8 = lVar8 + 1) {
        pSVar9 = (SorterRecord *)p[lVar8];
        pSVar5 = pSVar4;
        if ((pSVar9 != (SorterRecord *)0x0) && (pSVar5 = pSVar9, pSVar4 != (SorterRecord *)0x0)) {
          pSVar5 = vdbeSorterMerge(pTask,pSVar4,pSVar9);
        }
        pSVar4 = pSVar5;
      }
      pList->pList = pSVar4;
      sqlite3_free(p);
      uVar2 = (uint)pTask->pUnpacked->errCode;
    }
  }
  return uVar2;
}

Assistant:

static int vdbeSorterSort(SortSubtask *pTask, SorterList *pList){
  int i;
  SorterRecord **aSlot;
  SorterRecord *p;
  int rc;

  rc = vdbeSortAllocUnpacked(pTask);
  if( rc!=SQLITE_OK ) return rc;

  p = pList->pList;
  pTask->xCompare = vdbeSorterGetCompare(pTask->pSorter);

  aSlot = (SorterRecord **)sqlite3MallocZero(64 * sizeof(SorterRecord *));
  if( !aSlot ){
    return SQLITE_NOMEM_BKPT;
  }

  while( p ){
    SorterRecord *pNext;
    if( pList->aMemory ){
      if( (u8*)p==pList->aMemory ){
        pNext = 0;
      }else{
        assert( p->u.iNext<sqlite3MallocSize(pList->aMemory) );
        pNext = (SorterRecord*)&pList->aMemory[p->u.iNext];
      }
    }else{
      pNext = p->u.pNext;
    }

    p->u.pNext = 0;
    for(i=0; aSlot[i]; i++){
      p = vdbeSorterMerge(pTask, p, aSlot[i]);
      aSlot[i] = 0;
    }
    aSlot[i] = p;
    p = pNext;
  }

  p = 0;
  for(i=0; i<64; i++){
    if( aSlot[i]==0 ) continue;
    p = p ? vdbeSorterMerge(pTask, p, aSlot[i]) : aSlot[i];
  }
  pList->pList = p;

  sqlite3_free(aSlot);
  assert( pTask->pUnpacked->errCode==SQLITE_OK 
       || pTask->pUnpacked->errCode==SQLITE_NOMEM 
  );
  return pTask->pUnpacked->errCode;
}